

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_program __thiscall
CLIntercept::createProgramWithBuiltinKernels(CLIntercept *this,cl_context context)

{
  mutex *__mutex;
  int iVar1;
  mapped_type *ppSVar2;
  undefined8 uVar3;
  cl_program p_Var4;
  cl_context local_20;
  
  __mutex = &this->m_Mutex;
  local_20 = context;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    ppSVar2 = std::
              map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
              ::operator[](&this->m_BuiltinKernelOverridesMap,&local_20);
    if (*ppSVar2 == (mapped_type)0x0) {
      p_Var4 = (cl_program)0x0;
    }
    else {
      p_Var4 = (*ppSVar2)->Program;
      (*(this->m_Dispatch).clRetainProgram)(p_Var4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return p_Var4;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

cl_program CLIntercept::createProgramWithBuiltinKernels(
    cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    SBuiltinKernelOverrides*    pOverrides = m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        program = pOverrides->Program;
        dispatch().clRetainProgram( program );
    }

    return program;
}